

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

Gia_Man_t * Jf_ManDeriveGia(Jf_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  word *pwVar6;
  Vec_Mem_t *pVVar7;
  word *pwVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint *__ptr;
  undefined4 *__s;
  Vec_Int_t *vCover;
  int *piVar13;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  size_t sVar14;
  char *pcVar15;
  Vec_Int_t *pVVar16;
  Gia_Obj_t *pGVar17;
  Gia_Man_t *pGVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  word uTruth;
  word Truth [4];
  word *local_90;
  word local_68;
  ulong local_60;
  word local_58 [5];
  
  uVar11 = p->pGia->nObjs;
  __ptr = (uint *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar11 - 1) {
    uVar12 = uVar11;
  }
  *__ptr = uVar12;
  if (uVar12 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)(int)uVar12 << 2);
  }
  *(undefined4 **)(__ptr + 2) = __s;
  __ptr[1] = uVar11;
  memset(__s,0xff,(long)(int)uVar11 << 2);
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar13 = (int *)malloc(0x40000);
  vCover->pArray = piVar13;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar13 = (int *)malloc(0x40);
  p_00->pArray = piVar13;
  iVar1 = p->pPars->nLutSize;
  uVar12 = 1 << ((char)iVar1 - 6U & 0x1f);
  if (iVar1 < 7) {
    uVar12 = 1;
  }
  local_68 = 0;
  p_01 = Gia_ManStart(uVar11);
  pGVar18 = p->pGia;
  pcVar3 = pGVar18->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar3);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar3);
  }
  p_01->pName = pcVar15;
  pcVar3 = pGVar18->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar3);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar3);
  }
  p_01->pSpec = pcVar15;
  iVar1 = pGVar18->nObjs * 6;
  iVar9 = iVar1 >> 0x1f;
  iVar1 = iVar1 / 5 + iVar9;
  iVar19 = (iVar1 - iVar9) + 100;
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < (iVar1 - iVar9) + 99U) {
    iVar10 = iVar19;
  }
  pVVar16->nCap = iVar10;
  if (iVar10 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar16->pArray = piVar13;
  pVVar16->nSize = iVar19;
  memset(piVar13,0,(long)iVar19 << 2);
  p_01->vLevels = pVVar16;
  if ((int)uVar11 < 1) {
LAB_006d5015:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pVVar16 = pGVar18->vCis;
  if (0 < pVVar16->nSize) {
    lVar21 = 0;
    do {
      uVar23 = pVVar16->pArray[lVar21];
      if (((long)(int)uVar23 < 0) || (pGVar18->nObjs <= (int)uVar23)) goto LAB_006d4f99;
      if (pGVar18->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar17 = Gia_ManAppendObj(p_01);
      uVar20 = *(ulong *)pGVar17;
      *(ulong *)pGVar17 = uVar20 | 0x9fffffff;
      *(ulong *)pGVar17 =
           uVar20 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_01->pObjs;
      if ((pGVar17 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar17)) {
LAB_006d4fb8:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar17 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_01->pObjs;
      if ((pGVar17 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar17)) goto LAB_006d4fb8;
      if (uVar11 <= uVar23) goto LAB_006d5015;
      __s[(int)uVar23] = (int)((ulong)((long)pGVar17 - (long)pGVar4) >> 2) * 0x55555556;
      lVar21 = lVar21 + 1;
      pGVar18 = p->pGia;
      pVVar16 = pGVar18->vCis;
    } while (lVar21 < pVVar16->nSize);
  }
  if (p->pPars->fCutMin == 0) {
    Gia_ObjComputeTruthTableStart(pGVar18,p->pPars->nLutSize);
  }
  Gia_ManHashStart(p_01);
  pGVar18 = p->pGia;
  if (0 < pGVar18->nObjs) {
    local_60 = (ulong)uVar12;
    local_90 = &local_68;
    lVar21 = 0;
    do {
      if (pGVar18->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGVar18->pObjs + lVar21;
      uVar5 = *(undefined8 *)pGVar4;
      uVar11 = (uint)uVar5;
      if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
         ((((uVar11 & 0x1fffffff) == 0x1fffffff ||
           ((uVar11 & 0x1fffffff) != ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff))) &&
          (pGVar18->pRefs[lVar21] != 0)))) {
        if ((p->vCuts).nSize <= lVar21) goto LAB_006d4fd7;
        uVar11 = (p->vCuts).pArray[lVar21];
        pwVar6 = (p->pMem).pPages[(int)uVar11 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar22 = (long)(int)(uVar11 & (p->pMem).uPageMask);
        if (p->pPars->fCutMin == 0) {
          p_00->nSize = 0;
          if ((*(byte *)((long)pwVar6 + lVar22 * 8 + 4) & 0xf) != 0) {
            uVar20 = 0;
            do {
              uVar11 = *(uint *)((long)pwVar6 + uVar20 * 4 + lVar22 * 8 + 8);
              if (uVar11 == 0) break;
              if ((int)uVar11 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10c,"int Abc_Lit2Var(int)");
              }
              Vec_IntPush(p_00,uVar11 >> 1);
              uVar20 = uVar20 + 1;
            } while (uVar20 < (*(uint *)((long)pwVar6 + lVar22 * 8 + 4) & 0xf));
            pGVar18 = p->pGia;
          }
          local_90 = Gia_ObjComputeTruthTableCut(pGVar18,pGVar4,p_00);
LAB_006d4d9f:
          p_00->nSize = 0;
          if ((*(byte *)((long)pwVar6 + lVar22 * 8 + 4) & 0xf) != 0) {
            uVar20 = 0;
            do {
              uVar11 = *(uint *)((long)pwVar6 + uVar20 * 4 + lVar22 * 8 + 8);
              if (uVar11 == 0) break;
              if ((int)uVar11 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x112,"int Abc_Lit2LitL(int *, int)");
              }
              uVar23 = *(uint *)(*(long *)(__ptr + 2) + (ulong)(uVar11 >> 1) * 4);
              if ((int)uVar23 < 0) goto LAB_006d4ff6;
              Vec_IntPush(p_00,uVar23 ^ uVar11 & 1);
              uVar20 = uVar20 + 1;
            } while (uVar20 < (*(uint *)((long)pwVar6 + lVar22 * 8 + 4) & 0xf));
          }
          uVar11 = Dsm_ManTruthToGia(p_01,local_90,p_00,vCover);
          if (p->pPars->fCutMin == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = *(uint *)((long)pwVar6 + lVar22 * 8 + 4) >> 8 & 1;
          }
          if ((int)uVar11 < 0) goto LAB_006d4ff6;
          if ((int)__ptr[1] <= lVar21) goto LAB_006d5015;
          *(uint *)(*(long *)(__ptr + 2) + lVar21 * 4) = uVar23 ^ uVar11;
          pGVar18 = p->pGia;
        }
        else {
          uVar11 = *(uint *)((long)pwVar6 + lVar22 * 8 + 4);
          uVar23 = uVar11 >> 9;
          if ((uVar11 & 0xf) == 1) {
            if (uVar23 != 1) {
              __assert_fail("Class == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                            ,0x653,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
            }
            uVar23 = (uint)pwVar6[lVar22 + 1];
            if ((int)uVar23 < 0) goto LAB_006d4ff6;
            uVar2 = *(uint *)(*(long *)(__ptr + 2) + (ulong)(uVar23 >> 1) * 4);
            if ((int)uVar2 < 0) goto LAB_006d4ff6;
            if ((int)__ptr[1] <= lVar21) goto LAB_006d5015;
            *(uint *)(*(long *)(__ptr + 2) + lVar21 * 4) = uVar2 ^ (uVar11 >> 8 ^ uVar23) & 1;
          }
          else {
            if ((uVar11 & 0xf) != 0) {
              if (p->pPars->fFuncDsd == 0) {
                pVVar7 = p->vTtMem;
                if (pVVar7->nEntries <= (int)uVar23) {
                  __assert_fail("i >= 0 && i < p->nEntries",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                }
                local_90 = local_58;
                if (0 < (int)uVar12) {
                  uVar11 = pVVar7->PageMask;
                  iVar1 = pVVar7->nEntrySize;
                  pwVar8 = pVVar7->ppPages[uVar23 >> ((byte)pVVar7->LogPageSze & 0x1f)];
                  uVar20 = 0;
                  do {
                    local_58[uVar20] = pwVar8[(long)(int)((uVar11 & uVar23) * iVar1) + uVar20];
                    uVar20 = uVar20 + 1;
                  } while (local_60 != uVar20);
                  local_90 = local_58;
                }
              }
              else {
                local_68 = Sdm_ManReadDsdTruth(p->pDsd,uVar23);
              }
              if ((p->pDsd != (Sdm_Man_t *)0x0) &&
                 (uVar11 = Sdm_ManReadDsdVarNum(p->pDsd,uVar23),
                 uVar11 != (*(uint *)((long)pwVar6 + lVar22 * 8 + 4) & 0xf))) {
                __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                              ,0x65d,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
              }
              goto LAB_006d4d9f;
            }
            if (0x1ff < uVar11) {
              __assert_fail("Class == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                            ,0x64d,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
            }
            if ((int)__ptr[1] <= lVar21) goto LAB_006d5015;
            *(uint *)(*(long *)(__ptr + 2) + lVar21 * 4) = uVar11 >> 8;
          }
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < pGVar18->nObjs);
  }
  pVVar16 = pGVar18->vCos;
  if (0 < pVVar16->nSize) {
    lVar21 = 0;
    do {
      iVar1 = pVVar16->pArray[lVar21];
      if (((long)iVar1 < 0) || (pGVar18->nObjs <= iVar1)) {
LAB_006d4f99:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar18->pObjs == (Gia_Obj_t *)0x0) break;
      uVar11 = *(uint *)(pGVar18->pObjs + iVar1);
      uVar12 = iVar1 - (uVar11 & 0x1fffffff);
      if (((int)uVar12 < 0) || ((int)__ptr[1] <= (int)uVar12)) {
LAB_006d4fd7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar12 = *(uint *)(*(long *)(__ptr + 2) + (ulong)uVar12 * 4);
      if ((int)uVar12 < 0) {
LAB_006d4ff6:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_01,uVar12 ^ uVar11 >> 0x1d & 1);
      lVar21 = lVar21 + 1;
      pGVar18 = p->pGia;
      pVVar16 = pGVar18->vCos;
    } while (lVar21 < pVVar16->nSize);
  }
  if (p->pPars->fCutMin == 0) {
    Gia_ObjComputeTruthTableStop(pGVar18);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->pGia->nRegs);
  pGVar18 = p_01;
  if (p->pPars->fCutMin == 0) {
    pGVar18 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
  }
  return pGVar18;
}

Assistant:

Gia_Man_t * Jf_ManDeriveGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, iLit, Class, * pCut;
    int nWords = Abc_Truth6WordNum(p->pPars->nLutSize);
    word uTruth = 0, * pTruth = &uTruth, Truth[JF_WORD_MAX];
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p->pGia)/5 + 100 );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStart( p->pGia, p->pPars->nLutSize );
    Gia_ManHashStart( pNew );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        // get the truth table
        if ( p->pPars->fCutMin )
        {
            Class = Jf_CutFuncClass( pCut );
            if ( Jf_CutSize(pCut) == 0 )
            {
                assert( Class == 0 );
                Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
                continue;
            }
            if ( Jf_CutSize(pCut) == 1 )
            {
                assert( Class == 1 );
                iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
                iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
                Vec_IntWriteEntry( vCopies, i, iLit );
                continue;
            }
            if ( p->pPars->fFuncDsd )
                uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
            else
                Abc_TtCopy( (pTruth = Truth), Vec_MemReadEntry(p->vTtMem, Class), nWords, 0 );
            assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        }
        else
        {
            Vec_IntClear( vLeaves );
            Jf_CutForEachLit( pCut, iLit, k )
                Vec_IntPush( vLeaves, Abc_Lit2Var(iLit) );
            pTruth = Gia_ObjComputeTruthTableCut( p->pGia, pObj, vLeaves );
        }
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
        iLit = Abc_LitNotCond( iLit, (p->pPars->fCutMin && Jf_CutFuncCompl(pCut)) );
        Vec_IntWriteEntry( vCopies, i, iLit );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStop( p->pGia );
    Vec_IntFree( vCopies );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
//    Dsm_ManReportStats();
    // perform cleanup
    if ( !p->pPars->fCutMin )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    return pNew;
}